

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::handleExportedMethods
          (Scope *this,span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers)

{
  long lVar1;
  undefined1 *puVar2;
  string_view *psVar3;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *ptVar4;
  bool bVar5;
  reference ppSVar6;
  DeferredMemberSymbol *pDVar7;
  ModportDeclarationSyntax *pMVar8;
  AnsiPortListSyntax *pAVar9;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>
  *pSVar10;
  long in_RDI;
  const_iterator cVar11;
  iterator iVar12;
  iterator iVar13;
  Token TVar14;
  string_view sVar15;
  string_view name_1;
  ModportSubroutinePortSyntax *msps;
  iterator it;
  string_view name;
  ModportNamedPortSyntax *mnps;
  ModportPortSyntax *subPort;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range5;
  bool isExport;
  ModportSubroutinePortListSyntax *portList;
  MemberSyntax *port;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *__range4;
  ModportItemSyntax *item;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range3;
  SyntaxNode *node;
  Symbol *symbol;
  iterator __end2;
  iterator __begin2;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  anon_class_8_1_8991fb9c create;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  foundImports;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  waitingForImport;
  size_t hash_3;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  locator loc;
  size_t pos0;
  size_t hash_2;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  size_t hash_4;
  uint n_4;
  value_type *p_4;
  value_type *elements_4;
  int mask_4;
  group_type *pg_4;
  size_t pos_4;
  prober pb_4;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc_1;
  size_t pos0_1;
  size_t hash_5;
  basic_string_view<char,_std::char_traits<char>_> *k_1;
  uint n_5;
  value_type *p_5;
  value_type *elements_5;
  int mask_5;
  group_type *pg_5;
  size_t pos_5;
  prober pb_5;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff368;
  undefined7 in_stack_fffffffffffff370;
  undefined1 in_stack_fffffffffffff377;
  ModportSubroutinePortSyntax *in_stack_fffffffffffff378;
  Token *in_stack_fffffffffffff380;
  raw_key_type *in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff390;
  uint in_stack_fffffffffffff394;
  ModportSubroutinePortSyntax **pos0_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *in_stack_fffffffffffff3a0;
  ModportSubroutinePortSyntax **ppMVar16;
  ModportSubroutinePortSyntax **args_2;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  *in_stack_fffffffffffff3d0;
  table_element_pointer in_stack_fffffffffffff3d8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  *in_stack_fffffffffffff3e0;
  table_element_pointer args_1;
  undefined7 in_stack_fffffffffffff3f0;
  undefined1 in_stack_fffffffffffff3f7;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffff3f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *in_stack_fffffffffffff400;
  bool local_b41;
  bool local_9c1;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_8f0;
  undefined1 local_8d8 [24];
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  *local_8c0;
  table_element_pointer local_8b8;
  iterator local_8b0;
  char_pointer local_8a0;
  table_element_pointer local_898;
  Token local_890;
  undefined1 local_880 [48];
  iterator local_850;
  char_pointer local_840;
  table_element_pointer local_838;
  iterator local_830;
  char_pointer local_820;
  table_element_pointer local_818;
  string_view local_810;
  ModportNamedPortSyntax *local_800;
  SyntaxNode *local_7f8;
  iterator local_7f0;
  iterator local_7e0;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *local_7d0;
  byte local_7c1;
  ModportSubroutinePortListSyntax *local_7c0;
  MemberSyntax *local_7b8;
  iterator local_7b0;
  iterator local_7a0;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *local_790;
  ModportItemSyntax *local_788;
  const_iterator local_780;
  const_iterator local_770;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *local_760;
  SyntaxNode *local_758;
  Symbol *local_750;
  Symbol **local_748;
  __normal_iterator<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_740;
  undefined1 *local_738;
  ModportSubroutinePortSyntax *local_6b0 [2];
  size_t local_6a0;
  undefined1 local_630 [16];
  size_t local_620;
  ulong local_608;
  ulong local_600;
  undefined1 local_5f0 [16];
  undefined1 *local_5e0;
  long local_5d8;
  char_pointer local_5d0;
  table_element_pointer local_5c8;
  string_view *local_5c0;
  long local_5b8;
  char_pointer local_5b0;
  table_element_pointer local_5a8;
  string_view *local_5a0;
  ModportSubroutinePortSyntax **local_598;
  char_pointer local_590;
  table_element_pointer local_588;
  string_view *local_580;
  undefined1 *local_578;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_570;
  undefined1 *local_568;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  *local_560;
  table_element_pointer local_558;
  basic_string_view<char,_std::char_traits<char>_> *local_550;
  basic_string_view<char,_std::char_traits<char>_> *local_548;
  ModportSubroutinePortSyntax **local_540;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_538;
  string_view *local_520;
  long local_518;
  iterator local_510;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_500;
  undefined1 *local_4e8;
  long local_4e0;
  iterator local_4d8;
  size_t local_4c8;
  undefined1 *local_4c0;
  long local_4b8;
  size_t local_4b0;
  string_view *local_4a8;
  long local_4a0;
  uint local_494;
  value_type *local_490;
  value_type *local_488;
  uint local_47c;
  group_type *local_478;
  size_t local_470;
  pow2_quadratic_prober local_468;
  size_t local_458;
  size_t local_450;
  string_view *local_448;
  long local_440;
  uint local_434;
  value_type *local_430;
  value_type *local_428;
  uint local_41c;
  group_type *local_418;
  size_t local_410;
  pow2_quadratic_prober local_408;
  size_t local_3f8;
  size_t local_3f0;
  undefined1 *local_3e8;
  long local_3e0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
  local_3d8;
  string_view *local_3c0;
  ModportSubroutinePortSyntax **local_3b8;
  iterator local_3b0;
  size_t local_3a0;
  string_view *local_398;
  ModportSubroutinePortSyntax **local_390;
  uint local_384;
  value_type *local_380;
  value_type *local_378;
  uint local_36c;
  group_type *local_368;
  size_t local_360;
  pow2_quadratic_prober local_358;
  size_t local_348;
  size_t local_340;
  string_view *local_338;
  ModportSubroutinePortSyntax **local_330;
  string_view *local_328;
  undefined1 *local_320;
  bool local_311 [25];
  iterator local_2f8;
  bool local_2e1 [25];
  iterator local_2c8;
  bool local_2b1;
  iterator local_2b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_2a0;
  size_t local_288;
  size_t local_280;
  basic_string_view<char,_std::char_traits<char>_> *local_278;
  string_view *local_270;
  undefined1 *local_268;
  uint local_25c;
  value_type *local_258;
  value_type *local_250;
  uint local_244;
  group_type *local_240;
  size_t local_238;
  pow2_quadratic_prober local_230;
  size_t local_220;
  size_t local_218;
  basic_string_view<char,_std::char_traits<char>_> *local_210;
  undefined1 *local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_200;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_1e8;
  undefined1 *local_1e0;
  iterator local_1d8;
  size_t local_1c8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_1c0;
  undefined1 *local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_160;
  undefined1 *local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_148;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  ModportSubroutinePortSyntax **local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
  local_b0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_98;
  size_t local_90;
  Token *local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_70;
  ModportSubroutinePortSyntax **local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  *local_18;
  Token *local_10;
  ModportSubroutinePortSyntax **local_8;
  
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
              *)in_stack_fffffffffffff380);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
              *)in_stack_fffffffffffff380);
  local_738 = local_5f0;
  local_740._M_current =
       (Symbol **)
       std::span<slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffff368);
  local_748 = (Symbol **)
              std::span<slang::ast::Symbol_*const,_18446744073709551615UL>::end
                        ((span<slang::ast::Symbol_*const,_18446744073709551615UL> *)
                         in_stack_fffffffffffff378);
  do {
    bVar5 = __gnu_cxx::
            operator==<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370),
                       (__normal_iterator<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff368);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                   *)0x90adf6);
      SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
      ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                   *)0x90ae03);
      return;
    }
    ppSVar6 = __gnu_cxx::
              __normal_iterator<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_740);
    local_750 = *ppSVar6;
    pDVar7 = Symbol::as<(anonymous_namespace)::DeferredMemberSymbol>(local_750);
    local_758 = pDVar7->node;
    if (local_758->kind == ModportDeclaration) {
      pMVar8 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>(local_758);
      local_760 = &pMVar8->items;
      cVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x908d64);
      local_770 = cVar11;
      cVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end
                         ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x908da3);
      local_780 = cVar11;
      while( true ) {
        bVar5 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>_>
                          ((self_type *)
                           CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370),
                           (iterator_base<const_slang::syntax::ModportItemSyntax_*> *)
                           in_stack_fffffffffffff368);
        if (((bVar5 ^ 0xffU) & 1) == 0) break;
        local_788 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
                                 *)0x908e12);
        pAVar9 = not_null<slang::syntax::AnsiPortListSyntax_*>::operator->
                           ((not_null<slang::syntax::AnsiPortListSyntax_*> *)0x908e3d);
        local_790 = &pAVar9->ports;
        iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x908e68);
        local_7a0 = iVar12;
        iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)
                            CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370));
        local_7b0 = iVar12;
        while( true ) {
          bVar5 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
                            ((self_type *)
                             CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370),
                             (iterator_base<slang::syntax::MemberSyntax_*> *)
                             in_stack_fffffffffffff368);
          if (((bVar5 ^ 0xffU) & 1) == 0) break;
          local_7b8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                                   *)0x908f16);
          if ((local_7b8->super_SyntaxNode).kind == ModportSubroutinePortList) {
            local_7c0 = slang::syntax::SyntaxNode::
                        as<slang::syntax::ModportSubroutinePortListSyntax>
                                  (&local_7b8->super_SyntaxNode);
            local_7c1 = (local_7c0->importExport).kind == ExportKeyword;
            local_7d0 = &local_7c0->ports;
            iVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin
                               ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)0x908fa5);
            local_7e0 = iVar13;
            iVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end
                               ((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)
                                CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370));
            local_7f0 = iVar13;
            while( true ) {
              bVar5 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                                ((self_type *)
                                 CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370),
                                 (iterator_base<slang::syntax::ModportPortSyntax_*> *)
                                 in_stack_fffffffffffff368);
              if (((bVar5 ^ 0xffU) & 1) == 0) break;
              local_7f8 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                                        *)0x909053)->super_SyntaxNode;
              if (local_7f8->kind == ModportNamedPort) {
                if ((local_7c1 & 1) != 0) {
                  local_800 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                                        (local_7f8);
                  sVar15 = parsing::Token::valueText(in_stack_fffffffffffff380);
                  local_810 = sVar15;
                  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_810);
                  local_9c1 = true;
                  if (!bVar5) {
                    lVar1 = *(long *)(in_RDI + 0x10);
                    local_5c0 = &local_810;
                    local_5b8 = lVar1;
                    local_520 = local_5c0;
                    local_518 = lVar1;
                    local_4a8 = local_5c0;
                    local_4a0 = lVar1;
                    local_4b0 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                            *)CONCAT17(in_stack_fffffffffffff377,
                                                       in_stack_fffffffffffff370),
                                           in_stack_fffffffffffff368);
                    psVar3 = local_4a8;
                    local_450 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                                *)CONCAT17(in_stack_fffffffffffff377,
                                                           in_stack_fffffffffffff370),
                                               (size_t)in_stack_fffffffffffff368);
                    local_448 = psVar3;
                    local_458 = local_4b0;
                    local_440 = lVar1;
                    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                              (&local_468,local_450);
                    do {
                      local_470 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                            (&local_468);
                      local_478 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                            *)0x90926f);
                      local_478 = local_478 + local_470;
                      local_47c = boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::match
                                            ((group15<boost::unordered::detail::foa::plain_integral>
                                              *)in_stack_fffffffffffff378,
                                             CONCAT17(in_stack_fffffffffffff377,
                                                      in_stack_fffffffffffff370));
                      if (local_47c != 0) {
                        local_488 = boost::unordered::detail::foa::
                                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                                *)0x9092cd);
                        local_490 = local_488 + local_470 * 0xf;
                        do {
                          local_494 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                  *)0x909320);
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                          ::
                          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                                      *)0x909354);
                          bVar5 = std::
                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                  operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff394,
                                                         in_stack_fffffffffffff390),
                                             in_stack_fffffffffffff388,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             in_stack_fffffffffffff380);
                          if (bVar5) {
                            boost::unordered::detail::foa::
                            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                            ::table_locator(&local_538,local_478,local_494,local_490 + local_494);
                            goto LAB_00909470;
                          }
                          local_47c = local_47c - 1 & local_47c;
                        } while (local_47c != 0);
                      }
                      bVar5 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                                 *)CONCAT17(in_stack_fffffffffffff377,
                                                            in_stack_fffffffffffff370),
                                                (size_t)in_stack_fffffffffffff368);
                      if (bVar5) {
                        memset(&local_538,0,0x18);
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                        ::table_locator(&local_538);
                        goto LAB_00909470;
                      }
                      bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                        (&local_468,*(size_t *)(lVar1 + 8));
                    } while (bVar5);
                    memset(&local_538,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                    ::table_locator(&local_538);
LAB_00909470:
                    local_510 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                ::make_iterator((locator *)0x909481);
                    local_5b0 = local_510.pc_;
                    local_5a8 = local_510.p_;
                    local_820 = local_510.pc_;
                    local_818 = local_510.p_;
                    local_830 = boost::unordered::
                                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                       *)0x909522);
                    local_9c1 = boost::unordered::detail::foa::operator!=
                                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                            *)CONCAT17(in_stack_fffffffffffff377,
                                                       in_stack_fffffffffffff370),
                                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                            *)in_stack_fffffffffffff368);
                  }
                  if (local_9c1 == false) {
                    local_5a0 = &local_810;
                    local_598 = local_6b0;
                    local_3c0 = local_5a0;
                    local_3b8 = local_6b0;
                    local_398 = local_5a0;
                    local_390 = local_6b0;
                    local_3a0 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                            *)CONCAT17(in_stack_fffffffffffff377,
                                                       in_stack_fffffffffffff370),
                                           in_stack_fffffffffffff368);
                    psVar3 = local_398;
                    local_340 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                                *)CONCAT17(in_stack_fffffffffffff377,
                                                           in_stack_fffffffffffff370),
                                               (size_t)in_stack_fffffffffffff368);
                    local_338 = psVar3;
                    local_348 = local_3a0;
                    local_330 = local_6b0;
                    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                              (&local_358,local_340);
                    do {
                      local_360 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                            (&local_358);
                      local_368 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                            *)0x9096c3);
                      local_368 = local_368 + local_360;
                      local_36c = boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::match
                                            ((group15<boost::unordered::detail::foa::plain_integral>
                                              *)in_stack_fffffffffffff378,
                                             CONCAT17(in_stack_fffffffffffff377,
                                                      in_stack_fffffffffffff370));
                      if (local_36c != 0) {
                        local_378 = boost::unordered::detail::foa::
                                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                                *)0x909725);
                        local_380 = local_378 + local_360 * 0xf;
                        do {
                          local_384 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                  *)0x909778);
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                          ::
                          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>>
                                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>
                                      *)0x9097ac);
                          bVar5 = std::
                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                  operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff394,
                                                         in_stack_fffffffffffff390),
                                             in_stack_fffffffffffff388,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             in_stack_fffffffffffff380);
                          if (bVar5) {
                            boost::unordered::detail::foa::
                            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                            ::table_locator(&local_3d8,local_368,local_384,local_380 + local_384);
                            goto LAB_009098c8;
                          }
                          local_36c = local_36c - 1 & local_36c;
                        } while (local_36c != 0);
                      }
                      bVar5 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                                 *)CONCAT17(in_stack_fffffffffffff377,
                                                            in_stack_fffffffffffff370),
                                                (size_t)in_stack_fffffffffffff368);
                      if (bVar5) {
                        memset(&local_3d8,0,0x18);
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                        ::table_locator(&local_3d8);
                        goto LAB_009098c8;
                      }
                      bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                        (&local_358,local_6a0);
                    } while (bVar5);
                    memset(&local_3d8,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                    ::table_locator(&local_3d8);
LAB_009098c8:
                    local_3b0 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                ::make_iterator((locator *)0x9098d9);
                    local_590 = local_3b0.pc_;
                    local_588 = local_3b0.p_;
                    local_840 = local_3b0.pc_;
                    local_838 = local_3b0.p_;
                    local_850 = boost::unordered::
                                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                       *)0x909976);
                    bVar5 = boost::unordered::detail::foa::operator!=
                                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                        *)CONCAT17(in_stack_fffffffffffff377,
                                                   in_stack_fffffffffffff370),
                                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                        *)in_stack_fffffffffffff368);
                    if (bVar5) {
                      boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                    *)CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370))
                      ;
                      handleExportedMethods::anon_class_8_1_8991fb9c::operator()
                                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378);
                    }
                    else {
                      local_580 = &local_810;
                      local_578 = local_630;
                      local_328 = local_580;
                      local_320 = local_630;
                      local_270 = local_580;
                      local_268 = local_630;
                      local_278 = boost::unordered::detail::foa::
                                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                  ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                            ((basic_string_view<char,_std::char_traits<char>_> *)
                                             0x909a53);
                      local_280 = boost::unordered::detail::foa::
                                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                  ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                            ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                              *)CONCAT17(in_stack_fffffffffffff377,
                                                         in_stack_fffffffffffff370),
                                             in_stack_fffffffffffff368);
                      local_288 = boost::unordered::detail::foa::
                                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                  ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                                  *)CONCAT17(in_stack_fffffffffffff377,
                                                             in_stack_fffffffffffff370),
                                                 (size_t)in_stack_fffffffffffff368);
                      local_210 = local_278;
                      local_220 = local_280;
                      local_218 = local_288;
                      local_208 = local_630;
                      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                                (&local_230,local_288);
                      do {
                        local_238 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                              (&local_230);
                        local_240 = boost::unordered::detail::foa::
                                    table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                              *)0x909b56);
                        local_240 = local_240 + local_238;
                        local_244 = boost::unordered::detail::foa::
                                    group15<boost::unordered::detail::foa::plain_integral>::match
                                              ((group15<boost::unordered::detail::foa::plain_integral>
                                                *)in_stack_fffffffffffff378,
                                               CONCAT17(in_stack_fffffffffffff377,
                                                        in_stack_fffffffffffff370));
                        if (local_244 != 0) {
                          local_250 = boost::unordered::detail::foa::
                                      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                      ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                                  *)0x909bb8);
                          local_258 = local_250 + local_238 * 0xf;
                          do {
                            local_25c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                            boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                            ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    *)0x909c0b);
                            boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                            ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                      ((basic_string_view<char,_std::char_traits<char>_> *)0x909c3e)
                            ;
                            bVar5 = std::
                                    equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff394,
                                                             in_stack_fffffffffffff390),
                                                 in_stack_fffffffffffff388,
                                                 (basic_string_view<char,_std::char_traits<char>_> *
                                                 )in_stack_fffffffffffff380);
                            if (bVar5) {
                              boost::unordered::detail::foa::
                              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                              ::table_locator(&local_2a0,local_240,local_25c,local_258 + local_25c);
                              goto LAB_00909d5a;
                            }
                            local_244 = local_244 - 1 & local_244;
                          } while (local_244 != 0);
                        }
                        bVar5 = boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                is_not_overflowed((
                                                  group15<boost::unordered::detail::foa::plain_integral>
                                                  *)CONCAT17(in_stack_fffffffffffff377,
                                                             in_stack_fffffffffffff370),
                                                  (size_t)in_stack_fffffffffffff368);
                        if (bVar5) {
                          memset(&local_2a0,0,0x18);
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          ::table_locator(&local_2a0);
                          goto LAB_00909d5a;
                        }
                        bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                          (&local_230,local_620);
                      } while (bVar5);
                      memset(&local_2a0,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      ::table_locator(&local_2a0);
LAB_00909d5a:
                      bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                        ((table_locator *)&local_2a0);
                      if (bVar5) {
                        local_2b0 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    ::make_iterator((locator *)0x909d7a);
                        local_2b1 = false;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                                    *)(local_880 + 0x18),&local_2b0,&local_2b1);
                      }
                      else if (local_600 < local_608) {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                                  ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
                                   (size_t)in_stack_fffffffffffff388,
                                   (size_t)in_stack_fffffffffffff380,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff378);
                        local_2c8 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    ::make_iterator((locator *)0x909e02);
                        local_2e1[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                                    *)(local_880 + 0x18),&local_2c8,local_2e1);
                      }
                      else {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        ::
                        unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                                  (in_stack_fffffffffffff3e0,(size_t)in_stack_fffffffffffff3d8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff3d0);
                        local_2f8 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    ::make_iterator((locator *)0x909e6d);
                        local_311[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                                    *)(local_880 + 0x18),&local_2f8,local_311);
                      }
                    }
                  }
                }
              }
              else {
                local_880._16_8_ =
                     slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortSyntax>
                               (local_7f8);
                not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                          ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x909ee9);
                not_null<slang::syntax::NameSyntax_*>::operator->
                          ((not_null<slang::syntax::NameSyntax_*> *)0x909f04);
                TVar14 = slang::syntax::SyntaxNode::getLastToken
                                   ((SyntaxNode *)in_stack_fffffffffffff3a0);
                local_890 = TVar14;
                sVar15 = parsing::Token::valueText(in_stack_fffffffffffff380);
                local_880._0_16_ = (undefined1  [16])sVar15;
                bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_880);
                local_b41 = true;
                if (!bVar5) {
                  lVar1 = *(long *)(in_RDI + 0x10);
                  local_5e0 = local_880;
                  local_5d8 = lVar1;
                  local_4e8 = local_5e0;
                  local_4e0 = lVar1;
                  local_4c0 = local_5e0;
                  local_4b8 = lVar1;
                  local_4c8 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                          *)CONCAT17(in_stack_fffffffffffff377,
                                                     in_stack_fffffffffffff370),
                                         in_stack_fffffffffffff368);
                  puVar2 = local_4c0;
                  local_3f0 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                              *)CONCAT17(in_stack_fffffffffffff377,
                                                         in_stack_fffffffffffff370),
                                             (size_t)in_stack_fffffffffffff368);
                  local_3e8 = puVar2;
                  local_3f8 = local_4c8;
                  local_3e0 = lVar1;
                  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                            (&local_408,local_3f0);
                  do {
                    local_410 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                          (&local_408);
                    local_418 = boost::unordered::detail::foa::
                                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                          *)0x90a0fe);
                    local_418 = local_418 + local_410;
                    local_41c = boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::match
                                          ((group15<boost::unordered::detail::foa::plain_integral> *
                                           )in_stack_fffffffffffff378,
                                           CONCAT17(in_stack_fffffffffffff377,
                                                    in_stack_fffffffffffff370));
                    if (local_41c != 0) {
                      local_428 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                              *)0x90a15c);
                      local_430 = local_428 + local_410 * 0xf;
                      do {
                        local_434 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                *)0x90a1af);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        ::
                        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                                    *)0x90a1e3);
                        bVar5 = std::
                                equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            *)CONCAT44(in_stack_fffffffffffff394,
                                                       in_stack_fffffffffffff390),
                                           in_stack_fffffffffffff388,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_fffffffffffff380);
                        if (bVar5) {
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                          ::table_locator(&local_500,local_418,local_434,local_430 + local_434);
                          goto LAB_0090a2ff;
                        }
                        local_41c = local_41c - 1 & local_41c;
                      } while (local_41c != 0);
                    }
                    bVar5 = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                               *)CONCAT17(in_stack_fffffffffffff377,
                                                          in_stack_fffffffffffff370),
                                              (size_t)in_stack_fffffffffffff368);
                    if (bVar5) {
                      memset(&local_500,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                      ::table_locator(&local_500);
                      goto LAB_0090a2ff;
                    }
                    bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                      (&local_408,*(size_t *)(lVar1 + 8));
                  } while (bVar5);
                  memset(&local_500,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                  ::table_locator(&local_500);
LAB_0090a2ff:
                  local_4d8 = boost::unordered::detail::foa::
                              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                              ::make_iterator((locator *)0x90a310);
                  local_5d0 = local_4d8.pc_;
                  local_5c8 = local_4d8.p_;
                  local_8a0 = local_4d8.pc_;
                  local_898 = local_4d8.p_;
                  local_8b0 = boost::unordered::
                              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                              ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                     *)0x90a3b1);
                  local_b41 = boost::unordered::detail::foa::operator!=
                                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                          *)CONCAT17(in_stack_fffffffffffff377,
                                                     in_stack_fffffffffffff370),
                                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                          *)in_stack_fffffffffffff368);
                }
                if (local_b41 == false) {
                  if ((local_7c1 & 1) == 0) {
                    local_570 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                 *)local_880;
                    local_568 = local_630;
                    local_1e8 = local_570;
                    local_1e0 = local_630;
                    local_1c0 = local_570;
                    local_1b8 = local_630;
                    local_1c8 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                          ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                            *)CONCAT17(in_stack_fffffffffffff377,
                                                       in_stack_fffffffffffff370),
                                           in_stack_fffffffffffff368);
                    ptVar4 = local_1c0;
                    local_168 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                                *)CONCAT17(in_stack_fffffffffffff377,
                                                           in_stack_fffffffffffff370),
                                               (size_t)in_stack_fffffffffffff368);
                    local_160 = ptVar4;
                    local_170 = local_1c8;
                    local_158 = local_630;
                    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                              (&local_180,local_168);
                    do {
                      local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                            (&local_180);
                      local_190 = boost::unordered::detail::foa::
                                  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                  ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                            *)0x90a578);
                      local_190 = local_190 + local_188;
                      local_194 = boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::match
                                            ((group15<boost::unordered::detail::foa::plain_integral>
                                              *)in_stack_fffffffffffff378,
                                             CONCAT17(in_stack_fffffffffffff377,
                                                      in_stack_fffffffffffff370));
                      if (local_194 != 0) {
                        local_1a0 = boost::unordered::detail::foa::
                                    table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                    ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                                *)0x90a5da);
                        local_1a8 = local_1a0 + local_188 * 0xf;
                        do {
                          local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
                          in_stack_fffffffffffff3f8 =
                               boost::unordered::detail::foa::
                               table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                               ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                       *)0x90a62d);
                          in_stack_fffffffffffff400 = local_160;
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                          ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                    ((basic_string_view<char,_std::char_traits<char>_> *)0x90a660);
                          bVar5 = std::
                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                  operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                              *)CONCAT44(in_stack_fffffffffffff394,
                                                         in_stack_fffffffffffff390),
                                             in_stack_fffffffffffff388,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             in_stack_fffffffffffff380);
                          if (bVar5) {
                            boost::unordered::detail::foa::
                            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            ::table_locator(&local_200,local_190,local_1ac,local_1a8 + local_1ac);
                            goto LAB_0090a77c;
                          }
                          local_194 = local_194 - 1 & local_194;
                        } while (local_194 != 0);
                      }
                      in_stack_fffffffffffff3f7 =
                           boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                                      CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370),
                                      (size_t)in_stack_fffffffffffff368);
                      if ((bool)in_stack_fffffffffffff3f7) {
                        memset(&local_200,0,0x18);
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        ::table_locator(&local_200);
                        goto LAB_0090a77c;
                      }
                      bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                        (&local_180,local_620);
                    } while (bVar5);
                    memset(&local_200,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    ::table_locator(&local_200);
LAB_0090a77c:
                    local_1d8 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                ::make_iterator((locator *)0x90a78b);
                    local_560 = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                 *)local_1d8.pc_;
                    local_558 = local_1d8.p_;
                    local_8c0 = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                 *)local_1d8.pc_;
                    local_8b8 = local_1d8.p_;
                    in_stack_fffffffffffff3d0 =
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                          *)local_1d8.pc_;
                    in_stack_fffffffffffff3d8 = local_1d8.p_;
                    in_stack_fffffffffffff3e0 =
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                          *)local_1d8.pc_;
                    args_1 = local_1d8.p_;
                    local_8d8._8_16_ =
                         (undefined1  [16])
                         boost::unordered::
                         unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                         ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                                *)0x90a816);
                    bVar5 = boost::unordered::detail::foa::operator!=
                                      ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                        *)CONCAT17(in_stack_fffffffffffff377,
                                                   in_stack_fffffffffffff370),
                                       (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                        *)in_stack_fffffffffffff368);
                    if (bVar5) {
                      handleExportedMethods::anon_class_8_1_8991fb9c::operator()
                                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378);
                    }
                    else {
                      ppMVar16 = local_6b0;
                      local_8d8._0_8_ = local_880._16_8_;
                      local_548 = (basic_string_view<char,_std::char_traits<char>_> *)local_880;
                      local_550 = (basic_string_view<char,_std::char_traits<char>_> *)local_8d8;
                      local_540 = ppMVar16;
                      local_140 = local_550;
                      local_138 = local_548;
                      local_130 = ppMVar16;
                      pSVar10 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                      *)0x90a8e9);
                      boost::unordered::detail::foa::
                      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                      ::alloc_cted_or_fwded_key_type(&local_148,pSVar10,local_138);
                      local_78 = boost::unordered::detail::foa::
                                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                                 ::move_or_fwd(&local_148);
                      local_70 = &local_149;
                      local_80 = local_140;
                      args_2 = ppMVar16;
                      local_68 = ppMVar16;
                      local_88 = (Token *)boost::unordered::detail::foa::
                                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                          ::
                                          key_from<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax*>
                                                    (local_78,local_140);
                      local_90 = boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                             *)CONCAT17(in_stack_fffffffffffff377,
                                                        in_stack_fffffffffffff370),
                                            in_stack_fffffffffffff368);
                      in_stack_fffffffffffff3a0 =
                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                            *)boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                              *)CONCAT17(in_stack_fffffffffffff377,
                                                         in_stack_fffffffffffff370),
                                             (size_t)in_stack_fffffffffffff368);
                      local_10 = local_88;
                      local_20 = local_90;
                      pos0_00 = ppMVar16;
                      local_98 = in_stack_fffffffffffff3a0;
                      local_18 = in_stack_fffffffffffff3a0;
                      local_8 = ppMVar16;
                      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                                (&local_30,(size_t)in_stack_fffffffffffff3a0);
                      do {
                        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                             (&local_30);
                        local_40 = boost::unordered::detail::foa::
                                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                             *)0x90aa40);
                        local_40 = local_40 + local_38;
                        in_stack_fffffffffffff394 =
                             boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::match
                                       ((group15<boost::unordered::detail::foa::plain_integral> *)
                                        in_stack_fffffffffffff378,
                                        CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370
                                                ));
                        local_44 = in_stack_fffffffffffff394;
                        if (in_stack_fffffffffffff394 != 0) {
                          local_50 = boost::unordered::detail::foa::
                                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                                 *)0x90aa99);
                          local_58 = local_50 + local_38 * 0xf;
                          do {
                            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                            in_stack_fffffffffffff378 =
                                 (ModportSubroutinePortSyntax *)
                                 boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                         *)0x90aae9);
                            in_stack_fffffffffffff380 = local_10;
                            in_stack_fffffffffffff388 =
                                 boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                 ::
                                 key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>>
                                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>
                                             *)0x90ab17);
                            bVar5 = std::
                                    equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff394,
                                                             in_stack_fffffffffffff390),
                                                 in_stack_fffffffffffff388,
                                                 (basic_string_view<char,_std::char_traits<char>_> *
                                                 )in_stack_fffffffffffff380);
                            if (bVar5) {
                              boost::unordered::detail::foa::
                              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                              goto LAB_0090ac1e;
                            }
                            local_44 = local_44 - 1 & local_44;
                          } while (local_44 != 0);
                        }
                        in_stack_fffffffffffff377 =
                             boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                                *)CONCAT17(in_stack_fffffffffffff377,
                                                           in_stack_fffffffffffff370),
                                               (size_t)in_stack_fffffffffffff368);
                        if ((bool)in_stack_fffffffffffff377) {
                          memset(&local_b0,0,0x18);
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                          ::table_locator(&local_b0);
                          goto LAB_0090ac1e;
                        }
                        bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                          (&local_30,(size_t)pos0_00[2]);
                      } while (bVar5);
                      memset(&local_b0,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>_>
                      ::table_locator(&local_b0);
LAB_0090ac1e:
                      bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                        ((table_locator *)&local_b0);
                      if (bVar5) {
                        local_c0 = boost::unordered::detail::foa::
                                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                   ::make_iterator((locator *)0x90ac3e);
                        local_c1 = false;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_8f0,&local_c0,&local_c1);
                      }
                      else if (ppMVar16[6] < ppMVar16[5]) {
                        in_stack_fffffffffffff368 = local_80;
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                        ::
                        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                  (in_stack_fffffffffffff3a0,(size_t)pos0_00,
                                   CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
                                   (try_emplace_args_t *)in_stack_fffffffffffff388,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff380,args_2);
                        local_d8 = boost::unordered::detail::foa::
                                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                   ::make_iterator((locator *)0x90acda);
                        local_f1[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_8f0,&local_d8,local_f1);
                      }
                      else {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                        ::
                        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                  (in_stack_fffffffffffff400,(size_t)in_stack_fffffffffffff3f8,
                                   (try_emplace_args_t *)
                                   CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                                   args_1,(ModportSubroutinePortSyntax **)in_stack_fffffffffffff3e0)
                        ;
                        local_108 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                                    ::make_iterator((locator *)0x90ad52);
                        local_121[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_8f0,&local_108,local_121);
                      }
                    }
                  }
                  else {
                    handleExportedMethods::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff380,
                               in_stack_fffffffffffff378);
                  }
                }
              }
              iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
              ::
              operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>_>
                        ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_false>
                          *)CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370));
            }
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                      *)CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370));
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<const_slang::syntax::ModportItemSyntax_*>,_false>
                    *)CONCAT17(in_stack_fffffffffffff377,in_stack_fffffffffffff370));
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::ast::Symbol_*const_*,_std::span<slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_740);
  } while( true );
}

Assistant:

void Scope::handleExportedMethods(std::span<Symbol* const> deferredMembers) const {
    SmallSet<std::string_view, 4> waitingForImport;
    SmallMap<std::string_view, const ModportSubroutinePortSyntax*, 4> foundImports;

    auto create = [&](const ModportSubroutinePortSyntax& syntax) {
        auto& symbol = MethodPrototypeSymbol::implicitExtern(*this, syntax);
        insertMember(&symbol, nullptr, true, true);
    };

    for (auto symbol : deferredMembers) {
        auto& node = symbol->as<DeferredMemberSymbol>().node;
        if (node.kind != SyntaxKind::ModportDeclaration)
            continue;

        for (auto item : node.as<ModportDeclarationSyntax>().items) {
            for (auto port : item->ports->ports) {
                if (port->kind != SyntaxKind::ModportSubroutinePortList)
                    continue;

                auto& portList = port->as<ModportSubroutinePortListSyntax>();
                bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;

                for (auto subPort : portList.ports) {
                    switch (subPort->kind) {
                        case SyntaxKind::ModportNamedPort: {
                            // A simple named export is not enough to create a
                            // new extern prototype, but if an import has already
                            // declared it for us then we can take details from that.
                            // Otherwise remember it in case we see an import for it later.
                            if (isExport) {
                                auto& mnps = subPort->as<ModportNamedPortSyntax>();
                                auto name = mnps.name.valueText();
                                if (name.empty() || nameMap->find(name) != nameMap->end())
                                    break;

                                if (auto it = foundImports.find(name); it != foundImports.end())
                                    create(*it->second);
                                else
                                    waitingForImport.emplace(name);
                            }
                            break;
                        }
                        case SyntaxKind::ModportSubroutinePort: {
                            // If this is an export, see if this should create an implicit
                            // extern prototype. If it's an import then see if a previous
                            // export is waiting for it to be declared.
                            auto& msps = subPort->as<ModportSubroutinePortSyntax>();
                            auto name = msps.prototype->name->getLastToken().valueText();
                            if (name.empty() || nameMap->find(name) != nameMap->end())
                                break;

                            if (isExport) {
                                create(msps);
                            }
                            else {
                                if (waitingForImport.find(name) != waitingForImport.end())
                                    create(msps);
                                else
                                    foundImports.emplace(name, &msps);
                            }
                            break;
                        }
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
            }
        }
    }
}